

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::RleCompressor::compress(RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  if (0 < inSize) {
    pcVar1 = inPtr + inSize;
    pcVar5 = this->_tmpBuffer;
    do {
      *pcVar5 = *inPtr;
      if (pcVar1 <= inPtr + 1) break;
      pcVar5[inSize + 1U >> 1] = inPtr[1];
      pcVar5 = pcVar5 + 1;
      inPtr = inPtr + 2;
    } while (inPtr < pcVar1);
  }
  if (1 < inSize) {
    pcVar1 = this->_tmpBuffer;
    pcVar5 = pcVar1 + 1;
    cVar4 = *pcVar1;
    do {
      cVar2 = *pcVar5;
      *pcVar5 = (cVar2 - cVar4) + -0x80;
      pcVar5 = pcVar5 + 1;
      cVar4 = cVar2;
    } while (pcVar5 < pcVar1 + inSize);
  }
  *outPtr = this->_outBuffer;
  iVar3 = rleCompress(inSize,this->_tmpBuffer,this->_outBuffer);
  return iVar3;
}

Assistant:

int
RleCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Reorder the pixel data.
    //

    {
	char *t1 = _tmpBuffer;
	char *t2 = _tmpBuffer + (inSize + 1) / 2;
	const char *stop = inPtr + inSize;

	while (true)
	{
	    if (inPtr < stop)
		*(t1++) = *(inPtr++);
	    else
		break;

	    if (inPtr < stop)
		*(t2++) = *(inPtr++);
	    else
		break;
	}
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + inSize;
	int p = t[-1];

	while (t < stop)
	{
	    int d = int (t[0]) - p + (128 + 256);
	    p = t[0];
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Run-length encode the data.
    //

    outPtr = _outBuffer;
    return rleCompress (inSize, _tmpBuffer, (signed char *) _outBuffer);
}